

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_dump_ops_sparc(TCGContext_conflict7 *s,_Bool have_prefs,char *headline)

{
  TCGOp *op;
  ulong uVar1;
  anon_union_16_2_aaf24f3d_for_link *paVar2;
  int iVar3;
  
  fprintf(_stderr,"\n*** %s\n");
  uVar1 = 0;
  iVar3 = 0;
  paVar2 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
  while (op = paVar2->tqe_next, op != (TCGOp *)0x0) {
    if (*(char *)op == -0x7f) {
      fprintf(_stderr,"\n insn_idx=%d",uVar1);
      uVar1 = (ulong)((int)uVar1 + 1);
      iVar3 = 1;
    }
    else {
      fprintf(_stderr," %d: ",iVar3);
      iVar3 = iVar3 + 1;
    }
    tcg_dump_op_sparc(s,have_prefs,op);
    paVar2 = &op->link;
  }
  return;
}

Assistant:

void tcg_dump_ops(TCGContext *s, bool have_prefs, const char *headline)
{
    TCGOp *op;
    int insn_idx = 0;
    int op_idx = 0;

    fprintf(stderr, "\n*** %s\n", headline);
    // tcg_dump_tbs(s, tcg_dump_tb, NULL);

    QTAILQ_FOREACH(op, &s->ops, link) {
        if (op->opc == INDEX_op_insn_start) {
            fprintf(stderr, "\n insn_idx=%d", insn_idx);
            insn_idx++;
            op_idx = 0;
        } else {
            fprintf(stderr, " %d: ", op_idx);
        }
        op_idx++;
        tcg_dump_op(s, have_prefs, op);
    }
}